

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O2

bool __thiscall SGParser::Generator::NFA::Create(NFA *this,NFA *n,uint newLexemeId)

{
  pointer ppNVar1;
  bool bVar2;
  uint uVar3;
  mapped_type pNVar4;
  mapped_type *ppNVar5;
  _Base_ptr p_Var6;
  pointer ppNVar7;
  undefined1 local_c8 [8];
  map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
  pointerMap;
  NodeSet graph;
  mapped_type local_48;
  NFANode *ptr;
  NFANode *local_38;
  NFANode *igraph;
  
  if ((this->pStartState == (NFANode *)0x0) && (n->pStartState != (NFANode *)0x0)) {
    graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&graph;
    graph._M_t._M_impl._0_4_ = 0;
    graph._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    graph._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    graph._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    graph._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    ptr._4_4_ = newLexemeId;
    TraverseGraph(this,n->pStartState,
                  (NodeSet *)&pointerMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pointerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&pointerMap;
    pointerMap._M_t._M_impl._0_4_ = 0;
    pointerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    pointerMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    pointerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    pointerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         pointerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    for (p_Var6 = graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 != (_Rb_tree_node_base *)&graph; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6))
    {
      local_38 = *(NFANode **)(p_Var6 + 1);
      pNVar4 = (mapped_type)operator_new(0x38);
      (pNVar4->LinkPtr).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pNVar4->LinkPtr).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pNVar4->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pNVar4->LinkPtr).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pNVar4->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pNVar4->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ppNVar5 = std::
                map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                              *)local_c8,&local_38);
      *ppNVar5 = pNVar4;
    }
    p_Var6 = graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    while (p_Var6 != (_Base_ptr)&graph) {
      local_38 = *(NFANode **)(p_Var6 + 1);
      graph._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var6;
      ppNVar5 = std::
                map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                              *)local_c8,&local_38);
      pNVar4 = *ppNVar5;
      pNVar4->AcceptingState = local_38->AcceptingState;
      pNVar4->Id = local_38->Id;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&pNVar4->LinkChar,&local_38->LinkChar);
      ppNVar1 = (local_38->LinkPtr).
                super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppNVar7 = (local_38->LinkPtr).
                     super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppNVar7 != ppNVar1;
          ppNVar7 = ppNVar7 + 1) {
        local_48 = *ppNVar7;
        ppNVar5 = std::
                  map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                  ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                                *)local_c8,&local_48);
        std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ::push_back(&pNVar4->LinkPtr,ppNVar5);
      }
      p_Var6 = (_Base_ptr)
               std::_Rb_tree_increment
                         ((_Rb_tree_node_base *)
                          graph._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    ppNVar5 = std::
              map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
              ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                            *)local_c8,&n->pStartState);
    this->pStartState = *ppNVar5;
    ppNVar1 = (n->FinalState).
              super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppNVar7 = (n->FinalState).
                   super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppNVar7 != ppNVar1;
        ppNVar7 = ppNVar7 + 1) {
      local_38 = *ppNVar7;
      ppNVar5 = std::
                map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                ::operator[]((map<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                              *)local_c8,&local_38);
      local_48 = *ppNVar5;
      if ((ptr._4_4_ != 0) && (local_48->AcceptingState != 0)) {
        local_48->AcceptingState = ptr._4_4_;
      }
      std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
      push_back(&this->FinalState,&local_48);
    }
    uVar3 = ptr._4_4_;
    if (ptr._4_4_ == 0) {
      uVar3 = n->LexemeId;
    }
    this->LexemeId = uVar3;
    std::
    _Rb_tree<SGParser::Generator::NFANode_*,_std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>,_std::_Select1st<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
    ::~_Rb_tree((_Rb_tree<SGParser::Generator::NFANode_*,_std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>,_std::_Select1st<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<std::pair<SGParser::Generator::NFANode_*const,_SGParser::Generator::NFANode_*>_>_>
                 *)local_c8);
    std::
    _Rb_tree<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::_Identity<SGParser::Generator::NFANode_*>,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
    ::~_Rb_tree((_Rb_tree<SGParser::Generator::NFANode_*,_SGParser::Generator::NFANode_*,_std::_Identity<SGParser::Generator::NFANode_*>,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
                 *)&pointerMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool NFA::Create(const NFA& n, unsigned newLexemeId) {
    // Make sure this NFA is empty
    if (pStartState)
        return false;
    // Can't copy an empty NFA
    if (!n.pStartState)
        return false;

    // Make a list of all nodes in n
    NodeSet graph;

    TraverseGraph(n.pStartState, graph);

    // Make a new node in this graph for all these nodes. Make a hash
    // that maps from the old pointer address to the new pointer address
    std::map<NFANode*, NFANode*> pointerMap;

    for (const auto igraph : graph)
        pointerMap[igraph] = new NFANode;

    // Go through all of the nodes in the old graph and copy them to
    // the new graph. Translate the pointers in the LinkPtr field
    // using the pointerMap created above
    for (const auto n1 : graph) {
        const auto n2 = pointerMap[n1];

        n2->AcceptingState = n1->AcceptingState;
        n2->Id             = n1->Id;
        n2->LinkChar       = n1->LinkChar;

        for (const auto ptr : n1->LinkPtr)
            n2->LinkPtr.push_back(pointerMap[ptr]);
    }

    // Set the start node equal to n1's start node
    pStartState = pointerMap[n.pStartState];

    // Copy/translate the final state std::vector
    for (const auto fs : n.FinalState) {
        const auto ptr = pointerMap[fs];

        if (newLexemeId && ptr->AcceptingState)
            ptr->AcceptingState = newLexemeId;

        FinalState.push_back(ptr);
    }

    LexemeId = newLexemeId ? newLexemeId : n.LexemeId;

    return true;
}